

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O2

void __thiscall
mod_verify::ModVerifyTest1<signed_char>::ModVerifyTest1(ModVerifyTest1<signed_char> *this)

{
  ostream *poVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  char r;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_52;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_51;
  string local_50;
  string local_30;
  
  local_51.m_int = -0x80;
  local_50._M_dataplus._M_p._0_4_ = 0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(&local_52,(int *)&local_50);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%(&local_51,local_52);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<signed_char>();
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&local_50);
  to_hex<signed_char>(&local_50,local_51.m_int);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<signed_char>(&local_30,local_52.m_int);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_50._M_dataplus._M_p._0_4_ = CONCAT31(local_50._M_dataplus._M_p._1_3_,local_51.m_int);
  operator%=((char *)&local_50,local_52);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<signed_char>();
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&local_50);
  to_hex<signed_char>(&local_50,local_51.m_int);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<signed_char>(&local_30,local_52.m_int);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}